

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O0

ssize_t __thiscall
pstore::romfs::open_file::read(open_file *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 extraout_var;
  unsigned_long *puVar2;
  undefined4 in_register_00000034;
  void *local_60;
  void *buffer;
  void *local_50;
  uint8_t *start;
  size_t num_read;
  unsigned_long local_38;
  type file_size;
  size_t count_local;
  size_t size_local;
  open_file *this_local;
  not_null<void_*> b_local;
  
  this_local = (open_file *)CONCAT44(in_register_00000034,__fd);
  if ((__buf == (void *)0x0) || (__nbytes == 0)) {
    b_local.ptr_ = (void *)0x0;
  }
  else {
    file_size = __nbytes;
    count_local = (size_t)__buf;
    size_local = (size_t)this;
    iVar1 = dirent::stat(this->dir_,(char *)this_local,(stat *)__buf);
    num_read = 0;
    puVar2 = std::max<unsigned_long>((unsigned_long *)CONCAT44(extraout_var,iVar1),&num_read);
    local_38 = *puVar2;
    start = (uint8_t *)0x0;
    buffer = (void *)dirent::contents(this->dir_);
    local_50 = pstore::gsl::not_null<const_void_*>::get((not_null<const_void_*> *)&buffer);
    local_50 = (void *)((long)local_50 + this->pos_);
    local_60 = pstore::gsl::not_null::operator_cast_to_void_((not_null *)&this_local);
    for (; start < file_size; start = start + 1) {
      if (local_38 < this->pos_ + count_local) {
        return (ssize_t)start;
      }
      memcpy(local_60,local_50,count_local);
      local_50 = (void *)(count_local + (long)local_50);
      local_60 = (void *)((long)local_60 + count_local);
      this->pos_ = count_local + this->pos_;
    }
    b_local.ptr_ = start;
  }
  return (ssize_t)b_local.ptr_;
}

Assistant:

std::size_t open_file::read (not_null<void *> const b, std::size_t const size,
                                     std::size_t const count) {
            if (size == 0 || count == 0) {
                return 0;
            }
            auto const file_size =
                std::make_unsigned<off_t>::type (std::max (dir_.stat ().size, std::size_t{0}));
            auto num_read = std::size_t{0};
            auto const * start =
                reinterpret_cast<std::uint8_t const *> (dir_.contents ().get ()) + pos_;
            void * buffer = b;
            for (; num_read < count; ++num_read) {
                if (pos_ + size > file_size) {
                    return num_read;
                }
                std::memcpy (buffer, start, size);
                start += size;
                buffer = reinterpret_cast<std::uint8_t *> (buffer) + size;
                pos_ += size;
            }
            return num_read;
        }